

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall
CTPNStmCatch::gen_code_catch(CTPNStmCatch *this,ulong start_prot_ofs,ulong end_prot_ofs)

{
  tc_symtype_t tVar1;
  CTcPrsSymtab *this_00;
  CTcSymObjBase *this_01;
  CTcPrsSymtab *in_RDX;
  CTcSymLocal *in_RSI;
  CTPNStmBase *in_RDI;
  CTcPrsSymtab *old_frame;
  ulong exc_obj_id;
  CTcSymbol *sym;
  undefined8 in_stack_ffffffffffffffa8;
  int copy_str;
  CTPNStmBase *in_stack_ffffffffffffffb0;
  CTcPrsSymtab *in_stack_ffffffffffffffb8;
  CTcCodeStream *in_stack_ffffffffffffffc0;
  CTcCodeStream *local_28;
  
  copy_str = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  CTPNStmBase::add_debug_line_rec(in_stack_ffffffffffffffb0);
  this_00 = CTcCodeStream::set_local_frame(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  CTcCodeStream::get_symtab(G_cs);
  this_01 = (CTcSymObjBase *)
            CTcPrsSymtab::find_or_def_undef
                      ((CTcPrsSymtab *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                       (size_t)in_stack_ffffffffffffffb0,copy_str);
  local_28 = (CTcCodeStream *)0x0;
  tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01);
  if (tVar1 == TC_SYM_OBJ) {
    local_28 = (CTcCodeStream *)CTcSymObjBase::get_obj_id(this_01);
  }
  else {
    tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)this_01);
    if (tVar1 != TC_SYM_UNKNOWN) {
      CTPNStmBase::log_error(in_RDI,0x2d07,(ulong)in_RDI[1].file_ & 0xffffffff,in_RDI[1].next_stm_);
    }
  }
  CTcGenTarg::get_exc_table(G_cg);
  CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
  CTcT3ExcTable::add_catch
            ((CTcT3ExcTable *)this_00,(ulong)in_RDI,(ulong)local_28,(ulong)in_RDX,(ulong)in_RSI);
  CTcGenTarg::clear_peephole(G_cg);
  CTcGenTarg::note_push((CTcGenTarg *)0x28b238);
  CTcSymLocal::gen_code_setlcl(in_RSI);
  if (in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    CTPNStmBase::gen_code_substm((CTPNStmBase *)this_00,(CTPNStm *)in_RDI);
  }
  CTcCodeStream::set_local_frame(local_28,in_RDX);
  return;
}

Assistant:

void CTPNStmCatch::gen_code_catch(ulong start_prot_ofs, ulong end_prot_ofs)
{
    CTcSymbol *sym;
    ulong exc_obj_id;
    CTcPrsSymtab *old_frame;

    /* add the source location of the 'catch' clause */
    add_debug_line_rec();

    /* set the local scope */
    old_frame = G_cs->set_local_frame(symtab_);

    /* look up the object defining the class of exceptions to catch */
    sym = G_cs->get_symtab()->find_or_def_undef(exc_class_,
                                                exc_class_len_, FALSE);

    /* assume we won't find a valid object ID */
    exc_obj_id = VM_INVALID_OBJ;

    /* if it's an object, get its ID */
    if (sym->get_type() == TC_SYM_OBJ)
    {
        /* get its object ID */
        exc_obj_id = ((CTcSymObj *)sym)->get_obj_id();
    }
    else if (sym->get_type() != TC_SYM_UNKNOWN)
    {
        /* 
         *   it's defined, but it's not an object - log an error (note
         *   that we don't log an error if the symbol is undefined,
         *   because find_or_def_undef() will already have logged an error
         *   for us) 
         */
        log_error(TCERR_CATCH_EXC_NOT_OBJ, (int)exc_class_len_, exc_class_);
    }

    /* add our exception table entry */
    G_cg->get_exc_table()->add_catch(start_prot_ofs, end_prot_ofs,
                                     exc_obj_id, G_cs->get_ofs());

    /* don't allow any peephole optimizations to affect this offset */
    G_cg->clear_peephole();

    /* 
     *   the VM automatically pushes a value onto the stack to perform the
     *   'catch' 
     */
    G_cg->note_push();

    /* 
     *   generate a SETLCL for our formal parameter, so that the exception
     *   object is stored in our local variable
     */
    exc_var_->gen_code_setlcl();
    
    /* generate code for our statement, if we have one */
    if (body_ != 0)
        gen_code_substm(body_);

    /* restore the enclosing local scope */
    G_cs->set_local_frame(old_frame);
}